

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

bool __thiscall RenX::Server::updateClientList(Server *this)

{
  int iVar1;
  rep rVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  string_view text;
  string_view text_00;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar2;
  sVar4 = (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
          _M_impl._M_node._M_size;
  sVar3 = getBotCount(this);
  if (sVar4 == sVar3) {
    bVar6 = false;
  }
  else {
    pcVar5 = anon_var_dwarf_5f456;
    if (3 < this->m_rconVersion) {
      pcVar5 = "cclientvarlist ID SCORE CREDITS PING\n";
    }
    text._M_str = pcVar5;
    text._M_len = 0x25;
    iVar1 = sendSocket(this,text);
    bVar6 = 0 < iVar1;
  }
  sVar4 = getBotCount(this);
  if (sVar4 != 0) {
    pcVar5 = anon_var_dwarf_5f478;
    if (3 < this->m_rconVersion) {
      pcVar5 = "cbotvarlist ID SCORE CREDITS\n";
    }
    text_00._M_str = pcVar5;
    text_00._M_len = 0x1d;
    iVar1 = sendSocket(this,text_00);
    bVar6 = (bool)(bVar6 | 0 < iVar1);
  }
  return bVar6;
}

Assistant:

bool RenX::Server::updateClientList() {
	m_lastClientListUpdate = std::chrono::steady_clock::now();

	int result = 0;
	if (this->players.size() != getBotCount()) {
		if (m_rconVersion >= 4)
			result = sendSocket("cclientvarlist ID SCORE CREDITS PING\n"sv) > 0;
		else
			result = sendSocket("cclientvarlist ID\xA0""SCORE\xA0""CREDITS\xA0""PING\n"sv) > 0;
	}

	if (getBotCount() != 0) {
		if (m_rconVersion >= 4)
			result |= sendSocket("cbotvarlist ID SCORE CREDITS\n"sv) > 0;
		else
			result |= sendSocket("cbotvarlist ID\xA0""SCORE\xA0""CREDITS\n"sv) > 0;
	}

	return result != 0;
}